

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantDouble(Allocator *allocator,SynBase *source,double value)

{
  VmType type;
  VmConstant *this;
  VmConstant *result;
  double value_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_b60c8::get<VmConstant>(allocator);
  type.structType = VmType::Double.structType;
  type.type = VmType::Double.type;
  type.size = VmType::Double.size;
  VmConstant::VmConstant(this,allocator,type,source);
  this->dValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantDouble(Allocator *allocator, SynBase *source, double value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Double, source);

	result->dValue = value;

	return result;
}